

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

int yy_get_next_buffer(void)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  YY_BUFFER_STATE pyVar8;
  YY_BUFFER_STATE *ppyVar9;
  size_t sVar10;
  
  pcVar2 = yytext;
  pcVar1 = yy_c_buf_p;
  sVar10 = yy_buffer_stack_top;
  ppyVar9 = yy_buffer_stack;
  pyVar8 = yy_buffer_stack[yy_buffer_stack_top];
  pcVar3 = pyVar8->yy_ch_buf;
  if (pcVar3 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (pyVar8->yy_fill_buffer == 0) {
    return ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  iVar7 = ~(uint)yytext + (int)yy_c_buf_p;
  if (0 < iVar7) {
    lVar6 = 0;
    do {
      pcVar3[lVar6] = pcVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar7 != (int)lVar6);
    pyVar8 = ppyVar9[sVar10];
  }
  if (pyVar8->yy_buffer_status != 2) {
    iVar5 = pyVar8->yy_buf_size;
    while (-2 < iVar7 - iVar5) {
      if (pyVar8->yy_is_our_buffer == 0) {
        pyVar8->yy_ch_buf = (char *)0x0;
LAB_0011dbe1:
        yy_fatal_error("fatal error - scanner input buffer overflow");
      }
      iVar4 = iVar5 - ((uint)-iVar5 >> 3);
      if (0 < iVar5) {
        iVar4 = iVar5 * 2;
      }
      pcVar3 = pyVar8->yy_ch_buf;
      pyVar8->yy_buf_size = iVar4;
      pcVar2 = (char *)realloc(pcVar3,(long)(iVar4 + 2));
      pyVar8->yy_ch_buf = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0011dbe1;
      yy_c_buf_p = pcVar2 + ((int)pcVar1 - (int)pcVar3);
      pyVar8 = ppyVar9[sVar10];
      pcVar1 = yy_c_buf_p;
      iVar5 = pyVar8->yy_buf_size;
    }
    iVar4 = 0;
    iVar5 = Getc();
    sVar10 = yy_buffer_stack_top;
    ppyVar9 = yy_buffer_stack;
    if (iVar5 != -1) {
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[iVar7] = (char)iVar5;
      iVar5 = 1;
      yy_n_chars = 1;
      pyVar8 = ppyVar9[sVar10];
      pyVar8->yy_n_chars = 1;
      goto LAB_0011db63;
    }
    pyVar8 = yy_buffer_stack[yy_buffer_stack_top];
  }
  yy_n_chars = 0;
  pyVar8->yy_n_chars = 0;
  if (iVar7 == 0) {
    yyrestart(yyin);
    pyVar8 = yy_buffer_stack[yy_buffer_stack_top];
    iVar4 = 1;
    ppyVar9 = yy_buffer_stack;
    sVar10 = yy_buffer_stack_top;
    iVar5 = yy_n_chars;
  }
  else {
    pyVar8->yy_buffer_status = 2;
    iVar4 = 2;
    iVar5 = 0;
  }
LAB_0011db63:
  iVar7 = iVar7 + iVar5;
  if (pyVar8->yy_buf_size < iVar7) {
    iVar5 = (iVar5 >> 1) + iVar7;
    pcVar3 = (char *)realloc(pyVar8->yy_ch_buf,(long)iVar5);
    ppyVar9[sVar10]->yy_ch_buf = pcVar3;
    pcVar3 = ppyVar9[sVar10]->yy_ch_buf;
    if (pcVar3 == (char *)0x0) {
      yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
    }
    ppyVar9[sVar10]->yy_buf_size = iVar5 + -2;
  }
  else {
    pcVar3 = pyVar8->yy_ch_buf;
  }
  yy_n_chars = iVar7;
  pcVar3[iVar7] = '\0';
  ppyVar9[sVar10]->yy_ch_buf[(long)iVar7 + 1] = '\0';
  yytext = ppyVar9[sVar10]->yy_ch_buf;
  return iVar4;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}